

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

bool testing::ValidateTestPropertyName
               (string *property_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reserved_names)

{
  ostream *poVar1;
  pointer pbVar2;
  AssertHelper AVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Message local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  ostream *local_58;
  string local_50;
  
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((reserved_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (reserved_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,property_name);
  pbVar9 = (reserved_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current != pbVar9) {
    Message::Message(&local_70);
    local_78 = local_70.ss_.ptr_;
    poVar1 = (ostream *)((long)local_70.ss_.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(property_name->_M_dataplus)._M_p,property_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    local_68 = pbVar9;
    local_60 = _Var4._M_current;
    local_58 = poVar1;
    Message::Message((Message *)&local_80);
    lVar5 = (long)(reserved_names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(reserved_names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if (lVar5 != 0) {
      uVar6 = lVar5 >> 5;
      piVar8 = &(local_80.data_)->line;
      lVar5 = 8;
      uVar7 = 0;
      do {
        if (2 < uVar6 && uVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar8,", ",2);
        }
        if (uVar7 == ((long)(reserved_names->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(reserved_names->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar8,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar8,"\'",1);
        pbVar2 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)piVar8,*(char **)((long)pbVar2 + lVar5 + -8),
                   *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar8,"\'",1);
        uVar7 = uVar7 + 1;
        uVar6 = (long)(reserved_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(reserved_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar5 = lVar5 + 0x20;
      } while (uVar7 < uVar6);
    }
    AVar3.data_ = local_80.data_;
    internal::StringStreamToString(&local_50,(stringstream *)local_80.data_);
    poVar1 = local_58;
    if (AVar3.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AVar3.data_ + 8))(AVar3.data_);
      local_80.data_ = (AssertHelperData *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/gtest/gtest-all.cc"
               ,0xcea,"Failed");
    _Var4._M_current = local_60;
    pbVar9 = local_68;
    internal::AssertHelper::operator=(&local_80,&local_70);
    internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78.ptr_ + 8))();
    }
  }
  return _Var4._M_current == pbVar9;
}

Assistant:

bool ValidateTestPropertyName(const std::string& property_name,
                              const std::vector<std::string>& reserved_names) {
  if (std::find(reserved_names.begin(), reserved_names.end(), property_name) !=
          reserved_names.end()) {
    ADD_FAILURE() << "Reserved key used in RecordProperty(): " << property_name
                  << " (" << FormatWordList(reserved_names)
                  << " are reserved by " << GTEST_NAME_ << ")";
    return false;
  }
  return true;
}